

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  cmGeneratedFileStream depFileStream;
  string sStack_2c8;
  cmAlphaNum local_2a8;
  undefined1 local_278 [616];
  
  if (this->Verbose == true) {
    local_278._0_8_ = &DAT_0000001a;
    local_278._8_8_ = "Clearing dependencies in \"";
    local_2a8.View_._M_str = (file->_M_dataplus)._M_p;
    local_2a8.View_._M_len = file->_M_string_length;
    cmStrCat<char[4]>(&sStack_2c8,(cmAlphaNum *)local_278,&local_2a8,(char (*) [4])0x65d649);
    cmSystemTools::Stdout(&sStack_2c8);
    std::__cxx11::string::~string((string *)&sStack_2c8);
  }
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,file,false,None);
  std::operator<<((ostream *)local_278,
                  "# Empty dependencies file\n# This may be replaced when dependencies are built.\n"
                 );
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file) const
{
  // Print verbose output.
  if (this->Verbose) {
    cmSystemTools::Stdout(
      cmStrCat("Clearing dependencies in \"", file, "\".\n"));
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                   "# This may be replaced when dependencies are built.\n";
}